

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_overwrite_int64(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  bson_t *pbVar4;
  undefined1 *puVar5;
  char *pcVar6;
  ulong uVar7;
  undefined1 *puVar8;
  undefined8 *puVar9;
  bson_t *pbVar10;
  bson_t *pbVar11;
  bson_t *pbVar12;
  TestSuite *suite;
  bson_t *pbVar13;
  double dVar14;
  undefined1 auVar15 [16];
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_2418 [4104];
  bson_t *pbStack_1410;
  code *pcStack_1408;
  undefined8 uStack_1390;
  undefined1 uStack_1388;
  TestSuite aTStack_1380 [5];
  code *pcStack_1288;
  int *piStack_1210;
  int iStack_1208;
  undefined1 auStack_1204 [4];
  undefined1 auStack_1200 [232];
  bson_t *pbStack_1118;
  undefined1 *puStack_1110;
  code *pcStack_1108;
  bson_t bStack_1100;
  bson_t abStack_1080 [2];
  undefined8 uStack_f48;
  char *pcStack_f40;
  bson_t *pbStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  bson_t *pbStack_f20;
  char *pcStack_f18;
  code *pcStack_f08;
  undefined1 auStack_f00 [128];
  undefined1 auStack_e80 [232];
  undefined1 *puStack_d98;
  undefined1 *puStack_d90;
  code *pcStack_d88;
  undefined1 auStack_d80 [128];
  undefined1 auStack_d00 [368];
  undefined1 *puStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [128];
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [128];
  undefined1 auStack_a00 [368];
  undefined8 *puStack_890;
  code *apcStack_888 [13];
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined1 auStack_810 [16];
  undefined8 auStack_800 [14];
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 auStack_780 [360];
  undefined1 *puStack_618;
  code *pcStack_608;
  undefined1 auStack_600 [128];
  undefined1 auStack_580 [368];
  undefined1 *puStack_410;
  code *pcStack_408;
  undefined1 auStack_400 [128];
  undefined1 auStack_380 [368];
  undefined1 *puStack_210;
  code *pcStack_208;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  puVar8 = local_180;
  pcStack_208 = (code *)0x12b24f;
  bson_init(puVar8);
  pcStack_208 = (code *)0x12b268;
  cVar1 = bson_append_int64(puVar8,"key",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12b2f9;
    test_bson_iter_overwrite_int64_cold_1();
LAB_0012b2f9:
    pcStack_208 = (code *)0x12b2fe;
    test_bson_iter_overwrite_int64_cold_2();
LAB_0012b2fe:
    pcStack_208 = (code *)0x12b303;
    test_bson_iter_overwrite_int64_cold_3();
LAB_0012b303:
    pcStack_208 = (code *)0x12b308;
    test_bson_iter_overwrite_int64_cold_4();
LAB_0012b308:
    pcStack_208 = (code *)0x12b30d;
    test_bson_iter_overwrite_int64_cold_5();
  }
  else {
    pcStack_208 = (code *)0x12b287;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b2f9;
    pcStack_208 = (code *)0x12b293;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 0x12) goto LAB_0012b2fe;
    pcStack_208 = (code *)0x12b2a8;
    bson_iter_overwrite_int64(auStack_200,0x1221);
    pcStack_208 = (code *)0x12b2bf;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    puVar8 = auStack_200;
    if (cVar1 == '\0') goto LAB_0012b303;
    pcStack_208 = (code *)0x12b2cb;
    iVar2 = bson_iter_type(auStack_200);
    puVar8 = auStack_200;
    if (iVar2 != 0x12) goto LAB_0012b308;
    pcStack_208 = (code *)0x12b2d8;
    lVar3 = bson_iter_int64(auStack_200);
    puVar8 = auStack_200;
    if (lVar3 == 0x1221) {
      pcStack_208 = (code *)0x12b2ed;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_overwrite_double;
  test_bson_iter_overwrite_int64_cold_6();
  puVar5 = auStack_380;
  pcStack_408 = (code *)0x12b332;
  puStack_210 = puVar8;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  bson_init(puVar5);
  pcStack_408 = (code *)0x12b34e;
  cVar1 = bson_append_double(0x4093487e5c91d14e,puVar5,"key",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_408 = (code *)0x12b3e6;
    test_bson_iter_overwrite_double_cold_1();
LAB_0012b3e6:
    pcStack_408 = (code *)0x12b3eb;
    test_bson_iter_overwrite_double_cold_2();
LAB_0012b3eb:
    pcStack_408 = (code *)0x12b3f0;
    test_bson_iter_overwrite_double_cold_3();
LAB_0012b3f0:
    pcStack_408 = (code *)0x12b3f5;
    test_bson_iter_overwrite_double_cold_4();
LAB_0012b3f5:
    pcStack_408 = (code *)0x12b3fa;
    test_bson_iter_overwrite_double_cold_5();
  }
  else {
    pcStack_408 = (code *)0x12b36d;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b3e6;
    pcStack_408 = (code *)0x12b379;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 1) goto LAB_0012b3eb;
    pcStack_408 = (code *)0x12b391;
    bson_iter_overwrite_double(0x40b2211f97247454,auStack_400);
    pcStack_408 = (code *)0x12b3a8;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    puVar5 = auStack_400;
    if (cVar1 == '\0') goto LAB_0012b3f0;
    pcStack_408 = (code *)0x12b3b4;
    iVar2 = bson_iter_type(auStack_400);
    puVar5 = auStack_400;
    if (iVar2 != 1) goto LAB_0012b3f5;
    pcStack_408 = (code *)0x12b3c1;
    dVar14 = (double)bson_iter_double(auStack_400);
    puVar5 = auStack_400;
    if ((dVar14 == 4641.1234) && (puVar5 = auStack_400, !NAN(dVar14))) {
      pcStack_408 = (code *)0x12b3da;
      bson_destroy(auStack_380);
      return;
    }
  }
  pcStack_408 = test_bson_iter_overwrite_bool;
  test_bson_iter_overwrite_double_cold_6();
  puVar8 = auStack_580;
  pcStack_608 = (code *)0x12b41f;
  puStack_410 = puVar5;
  pcStack_408 = (code *)&pcStack_208;
  bson_init(puVar8);
  pcStack_608 = (code *)0x12b438;
  cVar1 = bson_append_bool(puVar8,"key",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_608 = (code *)0x12b4be;
    test_bson_iter_overwrite_bool_cold_1();
LAB_0012b4be:
    pcStack_608 = (code *)0x12b4c3;
    test_bson_iter_overwrite_bool_cold_2();
LAB_0012b4c3:
    pcStack_608 = (code *)0x12b4c8;
    test_bson_iter_overwrite_bool_cold_3();
LAB_0012b4c8:
    pcStack_608 = (code *)0x12b4cd;
    test_bson_iter_overwrite_bool_cold_4();
LAB_0012b4cd:
    pcStack_608 = (code *)0x12b4d2;
    test_bson_iter_overwrite_bool_cold_5();
  }
  else {
    pcStack_608 = (code *)0x12b453;
    cVar1 = bson_iter_init_find(auStack_600,auStack_580,"key");
    if (cVar1 == '\0') goto LAB_0012b4be;
    pcStack_608 = (code *)0x12b45f;
    iVar2 = bson_iter_type(auStack_600);
    if (iVar2 != 8) goto LAB_0012b4c3;
    pcStack_608 = (code *)0x12b471;
    bson_iter_overwrite_bool(auStack_600,0);
    pcStack_608 = (code *)0x12b488;
    cVar1 = bson_iter_init_find(auStack_600,auStack_580,"key");
    puVar8 = auStack_600;
    if (cVar1 == '\0') goto LAB_0012b4c8;
    pcStack_608 = (code *)0x12b494;
    iVar2 = bson_iter_type(auStack_600);
    puVar8 = auStack_600;
    if (iVar2 != 8) goto LAB_0012b4cd;
    pcStack_608 = (code *)0x12b4a1;
    cVar1 = bson_iter_bool(auStack_600);
    puVar8 = auStack_600;
    if (cVar1 == '\0') {
      pcStack_608 = (code *)0x12b4b2;
      bson_destroy(auStack_580);
      return;
    }
  }
  pcStack_608 = test_bson_iter_overwrite_decimal128;
  test_bson_iter_overwrite_bool_cold_6();
  puVar9 = &uStack_790;
  uStack_788 = 0;
  uStack_790 = 1;
  uStack_818 = 0;
  uStack_820 = 2;
  puVar5 = auStack_780;
  apcStack_888[0] = (code *)0x12b51c;
  puStack_618 = puVar8;
  pcStack_608 = (code *)&pcStack_408;
  bson_init(puVar5);
  apcStack_888[0] = (code *)0x12b533;
  cVar1 = bson_append_decimal128(puVar5,"key",0xffffffff,puVar9);
  if (cVar1 == '\0') {
    apcStack_888[0] = (code *)0x12b603;
    test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
    apcStack_888[0] = (code *)0x12b608;
    test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
    apcStack_888[0] = (code *)0x12b60d;
    test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
    apcStack_888[0] = (code *)0x12b612;
    test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
    apcStack_888[0] = (code *)0x12b617;
    test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
    apcStack_888[0] = (code *)0x12b61c;
    test_bson_iter_overwrite_decimal128_cold_6();
  }
  else {
    apcStack_888[0] = (code *)0x12b557;
    cVar1 = bson_iter_init_find(auStack_800,auStack_780,"key");
    if (cVar1 == '\0') goto LAB_0012b603;
    apcStack_888[0] = (code *)0x12b56c;
    iVar2 = bson_iter_type(auStack_800);
    if (iVar2 != 0x13) goto LAB_0012b608;
    puVar9 = auStack_800;
    apcStack_888[0] = (code *)0x12b58a;
    bson_iter_overwrite_decimal128(puVar9,&uStack_820);
    apcStack_888[0] = (code *)0x12b5a1;
    cVar1 = bson_iter_init_find(puVar9,auStack_780,"key");
    if (cVar1 == '\0') goto LAB_0012b60d;
    apcStack_888[0] = (code *)0x12b5b2;
    iVar2 = bson_iter_type(auStack_800);
    if (iVar2 != 0x13) goto LAB_0012b612;
    apcStack_888[0] = (code *)0x12b5c9;
    cVar1 = bson_iter_decimal128(auStack_800,auStack_810);
    if (cVar1 == '\0') goto LAB_0012b617;
    auVar15[0] = -((char)uStack_820 == auStack_810[0]);
    auVar15[1] = -(uStack_820._1_1_ == auStack_810[1]);
    auVar15[2] = -(uStack_820._2_1_ == auStack_810[2]);
    auVar15[3] = -(uStack_820._3_1_ == auStack_810[3]);
    auVar15[4] = -(uStack_820._4_1_ == auStack_810[4]);
    auVar15[5] = -(uStack_820._5_1_ == auStack_810[5]);
    auVar15[6] = -(uStack_820._6_1_ == auStack_810[6]);
    auVar15[7] = -(uStack_820._7_1_ == auStack_810[7]);
    auVar15[8] = -((char)uStack_818 == auStack_810[8]);
    auVar15[9] = -(uStack_818._1_1_ == auStack_810[9]);
    auVar15[10] = -(uStack_818._2_1_ == auStack_810[10]);
    auVar15[0xb] = -(uStack_818._3_1_ == auStack_810[0xb]);
    auVar15[0xc] = -(uStack_818._4_1_ == auStack_810[0xc]);
    auVar15[0xd] = -(uStack_818._5_1_ == auStack_810[0xd]);
    auVar15[0xe] = -(uStack_818._6_1_ == auStack_810[0xe]);
    auVar15[0xf] = -(uStack_818._7_1_ == auStack_810[0xf]);
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff) {
      apcStack_888[0] = (code *)0x12b5f5;
      bson_destroy(auStack_780);
      return;
    }
  }
  apcStack_888[0] = test_bson_iter_recurse;
  test_bson_iter_overwrite_decimal128_cold_7();
  pcStack_b88 = (code *)0x12b63e;
  puStack_890 = puVar9;
  apcStack_888[0] = (code *)&pcStack_608;
  bson_init(auStack_a00);
  pcStack_b88 = (code *)0x12b64e;
  bson_init(auStack_b00);
  pcStack_b88 = (code *)0x12b664;
  cVar1 = bson_append_int32(auStack_b00,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_b88 = (code *)0x12b79e;
    test_bson_iter_recurse_cold_1();
LAB_0012b79e:
    pcStack_b88 = (code *)0x12b7a3;
    test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
    pcStack_b88 = (code *)0x12b7a8;
    test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
    pcStack_b88 = (code *)0x12b7ad;
    test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
    pcStack_b88 = (code *)0x12b7b2;
    test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
    pcStack_b88 = (code *)0x12b7b7;
    test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
    pcStack_b88 = (code *)0x12b7bc;
    test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
    pcStack_b88 = (code *)0x12b7c1;
    test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
    pcStack_b88 = (code *)0x12b7c6;
    test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
    pcStack_b88 = (code *)0x12b7cb;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_b88 = (code *)0x12b68a;
    cVar1 = bson_append_int32(auStack_b00,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b79e;
    pcStack_b88 = (code *)0x12b6b0;
    cVar1 = bson_append_int32(auStack_b00,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b7a3;
    pcStack_b88 = (code *)0x12b6d9;
    cVar1 = bson_append_array(auStack_a00,"key",0xffffffff,auStack_b00);
    if (cVar1 == '\0') goto LAB_0012b7a8;
    pcStack_b88 = (code *)0x12b6fd;
    cVar1 = bson_iter_init_find(auStack_a80,auStack_a00,"key");
    if (cVar1 == '\0') goto LAB_0012b7ad;
    pcStack_b88 = (code *)0x12b712;
    iVar2 = bson_iter_type(auStack_a80);
    if (iVar2 != 4) goto LAB_0012b7b2;
    pcStack_b88 = (code *)0x12b72b;
    cVar1 = bson_iter_recurse(auStack_a80,auStack_b80);
    if (cVar1 == '\0') goto LAB_0012b7b7;
    pcStack_b88 = (code *)0x12b742;
    cVar1 = bson_iter_find(auStack_b80,"0");
    if (cVar1 == '\0') goto LAB_0012b7bc;
    pcStack_b88 = (code *)0x12b755;
    cVar1 = bson_iter_find(auStack_b80,"1");
    if (cVar1 == '\0') goto LAB_0012b7c1;
    pcStack_b88 = (code *)0x12b768;
    cVar1 = bson_iter_find(auStack_b80,"2");
    if (cVar1 == '\0') goto LAB_0012b7c6;
    pcStack_b88 = (code *)0x12b774;
    cVar1 = bson_iter_next(auStack_b80);
    if (cVar1 == '\0') {
      pcStack_b88 = (code *)0x12b785;
      bson_destroy(auStack_a00);
      pcStack_b88 = (code *)0x12b792;
      bson_destroy(auStack_b00);
      return;
    }
  }
  pcStack_b88 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_d88 = (code *)0x12b7f0;
  puStack_b90 = auStack_b00;
  pcStack_b88 = (code *)apcStack_888;
  bson_init(auStack_d00);
  pcStack_d88 = (code *)0x12b809;
  cVar1 = bson_append_int32(auStack_d00,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_d88 = (code *)0x12b850;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
    pcStack_d88 = (code *)0x12b855;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_d88 = (code *)0x12b824;
    cVar1 = bson_iter_init_find_case(auStack_d80,auStack_d00,"foo");
    if (cVar1 == '\0') goto LAB_0012b850;
    pcStack_d88 = (code *)0x12b830;
    iVar2 = bson_iter_int32(auStack_d80);
    if (iVar2 == 0x4d2) {
      pcStack_d88 = (code *)0x12b844;
      bson_destroy(auStack_d00);
      return;
    }
  }
  pcStack_d88 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_f08 = (code *)0x12b878;
  puStack_d98 = auStack_d00;
  puStack_d90 = puVar5;
  pcStack_d88 = (code *)&pcStack_b88;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_f08 = (code *)0x12b88b;
  cVar1 = bson_iter_init(auStack_e80,pbVar4);
  if (cVar1 == '\0') {
    pcStack_f08 = (code *)0x12bab0;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
    pcStack_f08 = (code *)0x12bab5;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
    pcStack_f08 = (code *)0x12baba;
    test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
    pcStack_f08 = (code *)0x12babf;
    test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
    pcStack_f08 = (code *)0x12bac4;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
    pcStack_f08 = (code *)0x12bac9;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
    pcStack_f08 = (code *)0x12bace;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
    pcStack_f08 = (code *)0x12bad3;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
    pcStack_f08 = (code *)0x12bad8;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
    pcStack_f08 = (code *)0x12badd;
    test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
    pcStack_f08 = (code *)0x12bae2;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
    pcStack_f08 = (code *)0x12bae7;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
    pcStack_f08 = (code *)0x12baec;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_f08 = (code *)0x12b8aa;
    cVar1 = bson_iter_find_descendant(auStack_e80,"a.b.c.0",auStack_f00);
    if (cVar1 == '\0') goto LAB_0012bab0;
    pcStack_f08 = (code *)0x12b8ba;
    iVar2 = bson_iter_type(auStack_f00);
    if (iVar2 != 0x10) goto LAB_0012bab5;
    pcStack_f08 = (code *)0x12b8cb;
    iVar2 = bson_iter_int32(auStack_f00);
    if (iVar2 != 1) goto LAB_0012baba;
    pcStack_f08 = (code *)0x12b8dc;
    bson_destroy(pbVar4);
    pcStack_f08 = (code *)0x12b8e1;
    pbVar4 = (bson_t *)bson_bcon_magic();
    pcStack_f08 = (code *)0x0;
    pcStack_f18 = "]";
    pbStack_f20 = (bson_t *)0x14ad57;
    uStack_f28 = 1;
    uStack_f30 = 0xf;
    pcStack_f40 = "baz";
    uStack_f48 = 0x12b930;
    pbStack_f38 = pbVar4;
    puVar5 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
    pcStack_f08 = (code *)0x12b947;
    cVar1 = bson_iter_init(auStack_e80,puVar5);
    if (cVar1 == '\0') goto LAB_0012babf;
    pcStack_f08 = (code *)0x12b966;
    cVar1 = bson_iter_find_descendant(auStack_e80,"foo.bar.0.baz",auStack_f00);
    if (cVar1 == '\0') goto LAB_0012bac4;
    pcStack_f08 = (code *)0x12b976;
    iVar2 = bson_iter_type(auStack_f00);
    if (iVar2 != 0x10) goto LAB_0012bac9;
    pcStack_f08 = (code *)0x12b987;
    iVar2 = bson_iter_int32(auStack_f00);
    if (iVar2 != 1) goto LAB_0012bace;
    pcStack_f08 = (code *)0x12b998;
    bson_destroy(puVar5);
    pcStack_f08 = (code *)0x0;
    pcStack_f18 = (char *)0xf;
    uStack_f28 = 0x12b9c4;
    pbStack_f20 = pbVar4;
    puVar5 = (undefined1 *)bcon_new(0,"nModified",pbVar4,0xf,1,"n");
    pcStack_f08 = (code *)0x12b9db;
    cVar1 = bson_iter_init(auStack_e80,puVar5);
    if (cVar1 == '\0') goto LAB_0012bad3;
    pcStack_f08 = (code *)0x12b9fa;
    cVar1 = bson_iter_find_descendant(auStack_e80,"n",auStack_f00);
    if (cVar1 == '\0') goto LAB_0012bad8;
    pcStack_f08 = (code *)0x12ba0a;
    pcVar6 = (char *)bson_iter_key(auStack_f00);
    if ((*pcVar6 != 'n') || (pcVar6[1] != '\0')) goto LAB_0012badd;
    pcStack_f08 = (code *)0x12ba25;
    bson_destroy(puVar5);
    pcStack_f08 = (code *)0x0;
    pcStack_f18 = (char *)0xf;
    uStack_f28 = 0x12ba51;
    pbStack_f20 = pbVar4;
    pbVar4 = (bson_t *)bcon_new(0,"",pbVar4,0xf,1,"n");
    pcStack_f08 = (code *)0x12ba68;
    cVar1 = bson_iter_init(auStack_e80,pbVar4);
    if (cVar1 == '\0') goto LAB_0012bae2;
    pcStack_f08 = (code *)0x12ba83;
    cVar1 = bson_iter_find_descendant(auStack_e80,"n",auStack_f00);
    if (cVar1 == '\0') goto LAB_0012bae7;
    pcStack_f08 = (code *)0x12ba8f;
    pcVar6 = (char *)bson_iter_key(auStack_f00);
    if ((*pcVar6 == 'n') && (pcVar6[1] == '\0')) {
      pcStack_f08 = (code *)0x12baa2;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_f08 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar11 = &bStack_1100;
  pbVar12 = &bStack_1100;
  pbVar13 = &bStack_1100;
  pbVar10 = abStack_1080;
  pcStack_1108 = (code *)0x12bb15;
  pbStack_f20 = pbVar4;
  pcStack_f18 = puVar5;
  pcStack_f08 = (code *)&pcStack_d88;
  bson_init(pbVar10);
  pcStack_1108 = (code *)0x12bb2e;
  bson_append_int32(pbVar10,"int32[true]",0xffffffff,1);
  pcStack_1108 = (code *)0x12bb44;
  bson_append_int32(pbVar10,"int32[false]",0xffffffff,0);
  pcStack_1108 = (code *)0x12bb60;
  bson_append_int64(pbVar10,"int64[true]",0xffffffff,1);
  pcStack_1108 = (code *)0x12bb79;
  bson_append_int64(pbVar10,"int64[false]",0xffffffff,0);
  pcStack_1108 = (code *)0x12bb91;
  bson_append_double(0x3ff0000000000000,pbVar10,"int64[true]",0xffffffff);
  pcStack_1108 = (code *)0x12bba4;
  bson_append_double(pbVar10,"int64[false]",0xffffffff);
  pcStack_1108 = (code *)0x12bbb2;
  bson_iter_init(&bStack_1100,pbVar10);
  pcStack_1108 = (code *)0x12bbba;
  bson_iter_next(&bStack_1100);
  pcStack_1108 = (code *)0x12bbc2;
  cVar1 = bson_iter_as_bool(&bStack_1100);
  if (cVar1 == '\0') {
    pcStack_1108 = (code *)0x12bc5a;
    test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
    pcStack_1108 = (code *)0x12bc5f;
    test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
    pbVar11 = pbVar10;
    pcStack_1108 = (code *)0x12bc64;
    test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
    pcStack_1108 = (code *)0x12bc69;
    test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
    pbVar12 = pbVar11;
    pcStack_1108 = (code *)0x12bc6e;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_1108 = (code *)0x12bbd5;
    bson_iter_next(&bStack_1100);
    pcStack_1108 = (code *)0x12bbdd;
    cVar1 = bson_iter_as_bool(&bStack_1100);
    pbVar10 = &bStack_1100;
    if (cVar1 != '\0') goto LAB_0012bc5a;
    pcStack_1108 = (code *)0x12bbec;
    bson_iter_next(&bStack_1100);
    pcStack_1108 = (code *)0x12bbf4;
    cVar1 = bson_iter_as_bool(&bStack_1100);
    pbVar10 = &bStack_1100;
    if (cVar1 == '\0') goto LAB_0012bc5f;
    pcStack_1108 = (code *)0x12bc03;
    bson_iter_next(&bStack_1100);
    pcStack_1108 = (code *)0x12bc0b;
    cVar1 = bson_iter_as_bool(&bStack_1100);
    if (cVar1 != '\0') goto LAB_0012bc64;
    pcStack_1108 = (code *)0x12bc1a;
    bson_iter_next(&bStack_1100);
    pcStack_1108 = (code *)0x12bc22;
    cVar1 = bson_iter_as_bool(&bStack_1100);
    pbVar11 = &bStack_1100;
    if (cVar1 == '\0') goto LAB_0012bc69;
    pcStack_1108 = (code *)0x12bc31;
    bson_iter_next(&bStack_1100);
    pcStack_1108 = (code *)0x12bc39;
    cVar1 = bson_iter_as_bool(&bStack_1100);
    if (cVar1 == '\0') {
      pcStack_1108 = (code *)0x12bc4a;
      bson_destroy(abStack_1080);
      return;
    }
  }
  pcStack_1108 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_1288 = (code *)0x12bc91;
  pbStack_1118 = pbVar12;
  puStack_1110 = (undefined1 *)&bStack_1100;
  pcStack_1108 = (code *)&pcStack_f08;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_1288 = (code *)0x12bd06;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
    pcStack_1288 = (code *)0x12bd0b;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
    pcStack_1288 = (code *)0x12bd10;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
    pcStack_1288 = (code *)0x12bd15;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_1288 = (code *)0x12bca9;
    cVar1 = bson_iter_init(auStack_1200,pbVar4);
    pbVar12 = pbVar4;
    if (cVar1 == '\0') goto LAB_0012bd06;
    pcStack_1288 = (code *)0x12bcba;
    cVar1 = bson_iter_next(auStack_1200);
    if (cVar1 == '\0') goto LAB_0012bd0b;
    pbVar13 = (bson_t *)&iStack_1208;
    pcStack_1288 = (code *)0x12bcdd;
    bson_iter_binary(auStack_1200,auStack_1204,pbVar13,&piStack_1210);
    if (iStack_1208 != 4) goto LAB_0012bd10;
    if (*piStack_1210 == 0x34333231) {
      pcStack_1288 = (code *)0x12bcf8;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_1288 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_1390 = 0x100620800000009;
  uStack_1388 = 0;
  suite = aTStack_1380;
  pcStack_1408 = (code *)0x12bd51;
  pcStack_1288 = (code *)&pcStack_1108;
  cVar1 = bson_iter_init_from_data(suite,&uStack_1390,9);
  if (cVar1 == '\0') {
    pcStack_1408 = (code *)0x12bd93;
    test_bson_iter_from_data_cold_1();
LAB_0012bd93:
    pcStack_1408 = (code *)0x12bd98;
    test_bson_iter_from_data_cold_2();
LAB_0012bd98:
    pcStack_1408 = (code *)0x12bd9d;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_1380;
    pcStack_1408 = (code *)0x12bd62;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012bd93;
    suite = aTStack_1380;
    pcStack_1408 = (code *)0x12bd73;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012bd98;
    suite = aTStack_1380;
    pcStack_1408 = (code *)0x12bd85;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_1408 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_1410 = pbVar12;
  pcStack_1408 = (code *)pbVar13;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar7 = read(iVar2,auStack_2418,0x1000);
    if ((long)uVar7 < 0) goto LAB_0012be04;
    if (uVar7 != 0) {
      bson_new_from_data(auStack_2418,uVar7 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012be04:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_int64 (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_int64 (&b, "key", -1, 1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   bson_iter_overwrite_int64 (&iter, 4641);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT_CMPINT (bson_iter_int64 (&iter), ==, 4641);
   bson_destroy (&b);
}